

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

bool __thiscall tetgenio::load_vtk(tetgenio *this,char *filebasename)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  byte bVar6;
  int iVar7;
  size_t sVar8;
  FILE *__stream;
  ulong uVar9;
  double *pdVar10;
  facet *pfVar11;
  polygon *ppVar12;
  int *piVar13;
  long lVar14;
  double dVar15;
  uint local_e48;
  int smallestidx;
  int iStack_e3c;
  bool ImALittleEndian;
  int j;
  int i;
  int nn_old;
  int nn;
  int id3;
  int id2;
  int id1;
  int dummy;
  int line_count;
  int nfaces;
  int nverts;
  float _z;
  float _y;
  float _x;
  double *coord;
  char *bufferp;
  char fmt [64];
  char id [256];
  char mode [128];
  char line [2048];
  char infilename [1024];
  polygon *p;
  facet *f;
  FILE *fp;
  char *filebasename_local;
  tetgenio *this_local;
  
  line_count = 0;
  dummy = 0;
  id1 = 0;
  i = -1;
  j = -1;
  bVar5 = testIsBigEndian();
  bVar6 = (bVar5 ^ 0xffU) & 1;
  local_e48 = 0;
  strncpy(line + 0x7f8,filebasename,0x3ff);
  if (line[0x7f8] == '\0') {
    printf("Error:  No filename.\n");
    this_local._7_1_ = false;
  }
  else {
    sVar8 = strlen(line + 0x7f8);
    iVar7 = strcmp(line + sVar8 + 0x7f4,".vtk");
    if (iVar7 != 0) {
      strcat(line + 0x7f8,".vtk");
    }
    __stream = fopen(line + 0x7f8,"r");
    if (__stream == (FILE *)0x0) {
      printf("Error:  Unable to open file %s\n",line + 0x7f8);
      this_local._7_1_ = false;
    }
    else {
      printf("Opening %s.\n",line + 0x7f8);
      this->firstnumber = 0;
      strcpy(id + 0xf8,"BINARY");
      while (coord = (double *)readline(this,mode + 0x78,(FILE *)__stream,&id1),
            coord != (double *)0x0) {
        sVar8 = strlen(mode + 0x78);
        if (((((sVar8 != 0) && (mode[0x78] != '#')) && (mode[0x78] != '\n')) &&
            ((mode[0x78] != '\n' && (mode[0x78] != '\r')))) && (mode[0x78] != ' ')) {
          __isoc99_sscanf(mode + 0x78,"%s",fmt + 0x38);
          iVar7 = strcmp(fmt + 0x38,"ASCII");
          if (iVar7 == 0) {
            strcpy(id + 0xf8,"ASCII");
          }
          iVar7 = strcmp(fmt + 0x38,"POINTS");
          if (iVar7 == 0) {
            __isoc99_sscanf(mode + 0x78,"%s %d %s",fmt + 0x38,&line_count,&bufferp);
            if (0 < line_count) {
              this->numberofpoints = line_count;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = (long)(line_count * 3);
              uVar9 = SUB168(auVar1 * ZEXT816(8),0);
              if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
                uVar9 = 0xffffffffffffffff;
              }
              pdVar10 = (double *)operator_new__(uVar9);
              this->pointlist = pdVar10;
              local_e48 = line_count + 1;
            }
            iVar7 = strcmp(id + 0xf8,"BINARY");
            if (iVar7 == 0) {
              for (iStack_e3c = 0; iStack_e3c < line_count; iStack_e3c = iStack_e3c + 1) {
                __y = this->pointlist + iStack_e3c * 3;
                iVar7 = strcmp((char *)&bufferp,"double");
                if (iVar7 == 0) {
                  fread(__y,8,1,__stream);
                  fread(__y + 1,8,1,__stream);
                  fread(__y + 2,8,1,__stream);
                  if (bVar6 != 0) {
                    swapBytes((uchar *)__y,8);
                    swapBytes((uchar *)(__y + 1),8);
                    swapBytes((uchar *)(__y + 2),8);
                  }
                }
                else {
                  iVar7 = strcmp((char *)&bufferp,"float");
                  if (iVar7 != 0) {
                    printf("Error: Only float or double formats are supported!\n");
                    return false;
                  }
                  fread(&_z,4,1,__stream);
                  fread(&nverts,4,1,__stream);
                  fread(&nfaces,4,1,__stream);
                  if (bVar6 != 0) {
                    swapBytes((uchar *)&_z,4);
                    swapBytes((uchar *)&nverts,4);
                    swapBytes((uchar *)&nfaces,4);
                  }
                  *__y = (double)_z;
                  __y[1] = (double)(float)nverts;
                  __y[2] = (double)(float)nfaces;
                }
              }
            }
            else {
              iVar7 = strcmp(id + 0xf8,"ASCII");
              if (iVar7 == 0) {
                for (iStack_e3c = 0; iStack_e3c < line_count; iStack_e3c = iStack_e3c + 1) {
                  coord = (double *)readline(this,mode + 0x78,(FILE *)__stream,&id1);
                  if (coord == (double *)0x0) {
                    printf("Unexpected end of file on line %d in file %s\n",(ulong)(uint)id1,
                           line + 0x7f8);
                    fclose(__stream);
                    return false;
                  }
                  __y = this->pointlist + iStack_e3c * 3;
                  for (smallestidx = 0; smallestidx < 3; smallestidx = smallestidx + 1) {
                    if (*(char *)coord == '\0') {
                      printf("Syntax error reading vertex coords on line");
                      printf(" %d in file %s\n",(ulong)(uint)id1,line + 0x7f8);
                      fclose(__stream);
                      return false;
                    }
                    dVar15 = strtod((char *)coord,(char **)&coord);
                    __y[smallestidx] = dVar15;
                    coord = (double *)findnextnumber(this,(char *)coord);
                  }
                }
              }
            }
          }
          else {
            iVar7 = strcmp(fmt + 0x38,"POLYGONS");
            if (iVar7 == 0) {
              __isoc99_sscanf(mode + 0x78,"%s %d  %d",fmt + 0x38,&dummy,&id2);
              if (0 < dummy) {
                this->numberoffacets = dummy;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (long)dummy;
                uVar9 = SUB168(auVar2 * ZEXT816(0x20),0);
                if (SUB168(auVar2 * ZEXT816(0x20),8) != 0) {
                  uVar9 = 0xffffffffffffffff;
                }
                pfVar11 = (facet *)operator_new__(uVar9);
                this->facetlist = pfVar11;
              }
              iVar7 = strcmp(id + 0xf8,"BINARY");
              if (iVar7 == 0) {
                for (iStack_e3c = 0; iStack_e3c < dummy; iStack_e3c = iStack_e3c + 1) {
                  fread(&i,4,1,__stream);
                  if (bVar6 != 0) {
                    swapBytes((uchar *)&i,4);
                  }
                  if (iStack_e3c == 0) {
                    j = i;
                  }
                  if (i != j) {
                    printf("Error:  No mixed cells are allowed.\n");
                    return false;
                  }
                  if (i != 3) {
                    printf("Error: Only triangles are supported\n");
                    return false;
                  }
                  fread(&id3,4,1,__stream);
                  fread(&nn,4,1,__stream);
                  fread(&nn_old,4,1,__stream);
                  if (bVar6 != 0) {
                    swapBytes((uchar *)&id3,4);
                    swapBytes((uchar *)&nn,4);
                    swapBytes((uchar *)&nn_old,4);
                  }
                  pfVar11 = this->facetlist + iStack_e3c;
                  init((EVP_PKEY_CTX *)pfVar11);
                  pfVar11->numberofpolygons = 1;
                  ppVar12 = (polygon *)operator_new__(0x10);
                  pfVar11->polygonlist = ppVar12;
                  ppVar12 = pfVar11->polygonlist;
                  init((EVP_PKEY_CTX *)ppVar12);
                  ppVar12->numberofvertices = 3;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = (long)ppVar12->numberofvertices;
                  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
                  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
                    uVar9 = 0xffffffffffffffff;
                  }
                  piVar13 = (int *)operator_new__(uVar9);
                  ppVar12->vertexlist = piVar13;
                  *ppVar12->vertexlist = id3;
                  ppVar12->vertexlist[1] = nn;
                  ppVar12->vertexlist[2] = nn_old;
                  for (smallestidx = 0; smallestidx < 3; smallestidx = smallestidx + 1) {
                    if (ppVar12->vertexlist[smallestidx] < (int)local_e48) {
                      local_e48 = ppVar12->vertexlist[smallestidx];
                    }
                  }
                }
              }
              else {
                iVar7 = strcmp(id + 0xf8,"ASCII");
                if (iVar7 == 0) {
                  for (iStack_e3c = 0; iStack_e3c < dummy; iStack_e3c = iStack_e3c + 1) {
                    coord = (double *)readline(this,mode + 0x78,(FILE *)__stream,&id1);
                    lVar14 = strtol((char *)coord,(char **)&coord,0);
                    i = (int)lVar14;
                    if (iStack_e3c == 0) {
                      j = i;
                    }
                    if (i != j) {
                      printf("Error:  No mixed cells are allowed.\n");
                      return false;
                    }
                    if (i != 3) {
                      printf("Error:  Only triangles are supported.\n");
                      return false;
                    }
                    coord = (double *)findnextnumber(this,(char *)coord);
                    lVar14 = strtol((char *)coord,(char **)&coord,0);
                    id3 = (int)lVar14;
                    coord = (double *)findnextnumber(this,(char *)coord);
                    lVar14 = strtol((char *)coord,(char **)&coord,0);
                    nn = (int)lVar14;
                    coord = (double *)findnextnumber(this,(char *)coord);
                    lVar14 = strtol((char *)coord,(char **)&coord,0);
                    nn_old = (int)lVar14;
                    pfVar11 = this->facetlist + iStack_e3c;
                    init((EVP_PKEY_CTX *)pfVar11);
                    pfVar11->numberofpolygons = 1;
                    ppVar12 = (polygon *)operator_new__(0x10);
                    pfVar11->polygonlist = ppVar12;
                    ppVar12 = pfVar11->polygonlist;
                    init((EVP_PKEY_CTX *)ppVar12);
                    ppVar12->numberofvertices = 3;
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = (long)ppVar12->numberofvertices;
                    uVar9 = SUB168(auVar4 * ZEXT816(4),0);
                    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
                      uVar9 = 0xffffffffffffffff;
                    }
                    piVar13 = (int *)operator_new__(uVar9);
                    ppVar12->vertexlist = piVar13;
                    *ppVar12->vertexlist = id3;
                    ppVar12->vertexlist[1] = nn;
                    ppVar12->vertexlist[2] = nn_old;
                    for (smallestidx = 0; smallestidx < 3; smallestidx = smallestidx + 1) {
                      if (ppVar12->vertexlist[smallestidx] < (int)local_e48) {
                        local_e48 = ppVar12->vertexlist[smallestidx];
                      }
                    }
                  }
                }
              }
              fclose(__stream);
              if (local_e48 == 0) {
                this->firstnumber = 0;
              }
              else {
                if (local_e48 != 1) {
                  printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)local_e48,
                         line + 0x7f8);
                  return false;
                }
                this->firstnumber = 1;
              }
              return true;
            }
            iVar7 = strcmp(fmt + 0x38,"LINES");
            if ((iVar7 == 0) || (iVar7 = strcmp(fmt + 0x38,"CELLS"), iVar7 == 0)) {
              printf("Warning:  load_vtk(): cannot read formats LINES, CELLS.\n");
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tetgenio::load_vtk(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char line[INPUTLINESIZE];
  char mode[128], id[256], fmt[64];
  char *bufferp;
  double *coord;
  float _x, _y, _z;
  int nverts = 0;
  int nfaces = 0;
  int line_count = 0;
  int dummy;
  int id1, id2, id3;
  int nn = -1;
  int nn_old = -1;
  int i, j;
  bool ImALittleEndian = !testIsBigEndian();

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".vtk") != 0) {
    strcat(infilename, ".vtk");
  }
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  // Default uses the index starts from '0'.
  firstnumber = 0;
  strcpy(mode, "BINARY");

  while((bufferp = readline(line, fp, &line_count)) != NULL) {
    if(strlen(line) == 0) continue;
    //swallow lines beginning with a comment sign or white space
    if(line[0] == '#' || line[0]=='\n' || line[0] == 10 || line[0] == 13 || 
       line[0] == 32) continue;

    sscanf(line, "%s", id);
    if(!strcmp(id, "ASCII")) {
      strcpy(mode, "ASCII");
    }

    if(!strcmp(id, "POINTS")) {
      sscanf(line, "%s %d %s", id, &nverts, fmt);
      if (nverts > 0) {
        numberofpoints = nverts;
        pointlist = new REAL[nverts * 3];
        smallestidx = nverts + 1;
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nverts; i++) {
          coord = &pointlist[i * 3];
          if(!strcmp(fmt, "double")) {
            fread((char*)(&(coord[0])), sizeof(double), 1, fp);
            fread((char*)(&(coord[1])), sizeof(double), 1, fp);
            fread((char*)(&(coord[2])), sizeof(double), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &(coord[0]), sizeof(coord[0]));
              swapBytes((unsigned char *) &(coord[1]), sizeof(coord[1]));
              swapBytes((unsigned char *) &(coord[2]), sizeof(coord[2]));
            }
          } else if(!strcmp(fmt, "float")) {
            fread((char*)(&_x), sizeof(float), 1, fp);
            fread((char*)(&_y), sizeof(float), 1, fp);
            fread((char*)(&_z), sizeof(float), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &_x, sizeof(_x));
              swapBytes((unsigned char *) &_y, sizeof(_y));
              swapBytes((unsigned char *) &_z, sizeof(_z));
            }
            coord[0] = double(_x);
            coord[1] = double(_y);
            coord[2] = double(_z);
          } else {
            printf("Error: Only float or double formats are supported!\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nverts; i++){
          bufferp = readline(line, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            coord[j] = (REAL) strtod(bufferp, &bufferp);
            bufferp = findnextnumber(bufferp);
          }
        }
      }
      continue;
    }

    if(!strcmp(id, "POLYGONS")) {
      sscanf(line, "%s %d  %d", id, &nfaces, &dummy);
      if (nfaces > 0) {
        numberoffacets = nfaces;
        facetlist = new tetgenio::facet[nfaces];
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nfaces; i++){
          fread((char*)(&nn), sizeof(int), 1, fp);
          if(ImALittleEndian){
            swapBytes((unsigned char *) &nn, sizeof(nn));
          }
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if(nn == 3){
            fread((char*)(&id1), sizeof(int), 1, fp);
            fread((char*)(&id2), sizeof(int), 1, fp);
            fread((char*)(&id3), sizeof(int), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &id1, sizeof(id1));
              swapBytes((unsigned char *) &id2, sizeof(id2));
              swapBytes((unsigned char *) &id3, sizeof(id3));
            }
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error: Only triangles are supported\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nfaces; i++) {
          bufferp = readline(line, fp, &line_count);
          nn = (int) strtol(bufferp, &bufferp, 0);
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if (nn == 3) {
            bufferp = findnextnumber(bufferp); // Skip the first field.
            id1 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id2 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id3 = (int) strtol(bufferp, &bufferp, 0);
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error:  Only triangles are supported.\n");
            return false;
          }
        }
      }

      fclose(fp);

      // Decide the firstnumber of the index.
      if (smallestidx == 0) {
        firstnumber = 0;  
      } else if (smallestidx == 1) {
        firstnumber = 1;
      } else {
        printf("A wrong smallest index (%d) was detected in file %s\n",
               smallestidx, infilename);
        return false;
      }

      return true;
    }

    if(!strcmp(id,"LINES") || !strcmp(id,"CELLS")){
      printf("Warning:  load_vtk(): cannot read formats LINES, CELLS.\n");
    }
  } // while ()

  return true;
}